

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O3

void ect_train(ect *e,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  bool bVar2;
  size_t sVar3;
  example *peVar4;
  single_learner *psVar5;
  uint64_t uVar6;
  direction *pdVar7;
  uint32_t *puVar8;
  bool *pbVar9;
  undefined1 uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  bool *pbVar14;
  uint uVar15;
  byte bVar16;
  uint32_t uVar17;
  bool local_73;
  bool local_72;
  bool local_71;
  float local_70;
  float local_6c;
  v_array<bool> *local_68;
  ulong local_60;
  ect *local_58;
  example *local_50;
  uint local_44;
  single_learner *local_40;
  ulong local_38;
  
  if (e->k != 1) {
    uVar17 = (ec->l).multi.label;
    local_68 = &e->tournaments_won;
    local_50 = ec;
    local_40 = base;
    v_array<bool>::clear(local_68);
    peVar4 = local_50;
    uVar11 = uVar17 - 1;
    pdVar7 = (e->directions)._begin;
    uVar13 = (ulong)pdVar7[uVar11].winner;
    bVar16 = pdVar7[uVar13].left == uVar11;
    local_58 = e;
    do {
      psVar5 = local_40;
      local_6c = -1.0;
      local_60 = CONCAT71(local_60._1_7_,bVar16);
      if ((bVar16 & 1) == 0) {
        local_6c = 1.0;
      }
      (peVar4->l).simple.label = local_6c;
      (peVar4->l).simple.initial = 0.0;
      uVar17 = (uint32_t)uVar13;
      iVar12 = uVar17 - (int)e->k;
      puVar1 = &(peVar4->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(local_40 + 0xe0) * iVar12);
      (**(code **)(local_40 + 0x28))
                (*(undefined8 *)(local_40 + 0x18),*(undefined8 *)(local_40 + 0x20),peVar4);
      uVar6 = (peVar4->super_example_predict).ft_offset -
              (ulong)(uint)(iVar12 * *(int *)(psVar5 + 0xe0));
      (peVar4->super_example_predict).ft_offset = uVar6;
      local_70 = peVar4->weight;
      peVar4->weight = 0.0;
      iVar12 = uVar17 - (int)local_58->k;
      (peVar4->super_example_predict).ft_offset = (uint)(*(int *)(psVar5 + 0xe0) * iVar12) + uVar6;
      (**(code **)(psVar5 + 0x28))
                (*(undefined8 *)(psVar5 + 0x18),*(undefined8 *)(psVar5 + 0x20),peVar4);
      e = local_58;
      puVar1 = &(peVar4->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(iVar12 * *(int *)(psVar5 + 0xe0));
      peVar4->weight = local_70;
      pdVar7 = (local_58->directions)._begin;
      if (((peVar4->pred).scalar - local_58->class_boundary) * local_6c <= 0.0) {
        if (pdVar7[uVar13].last == false) {
          bVar16 = pdVar7[pdVar7[uVar13].loser].left == uVar17;
          if ((ulong)pdVar7[uVar13].loser == 0) {
            local_72 = false;
            v_array<bool>::push_back(local_68,&local_72);
          }
        }
        else {
          local_73 = false;
          v_array<bool>::push_back(local_68,&local_73);
          bVar16 = (byte)local_60;
        }
        puVar8 = &(e->directions)._begin[uVar13].loser;
      }
      else {
        if (pdVar7[uVar13].last == false) {
          bVar16 = pdVar7[pdVar7[uVar13].winner].left == uVar17;
        }
        else {
          local_71 = true;
          v_array<bool>::push_back(local_68,&local_71);
          pdVar7 = (e->directions)._begin;
          bVar16 = (byte)local_60;
        }
        puVar8 = &pdVar7[uVar13].winner;
      }
      uVar13 = (ulong)*puVar8;
    } while (*puVar8 != 0);
    if ((e->tournaments_won)._end == (e->tournaments_won)._begin) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"badness!",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    psVar5 = local_40;
    peVar4 = local_50;
    uVar13 = e->tree_height;
    if (uVar13 != 0) {
      pbVar9 = (e->tournaments_won)._begin;
      pbVar14 = (e->tournaments_won)._end;
      local_38 = 0;
      do {
        if (1 < (ulong)((long)pbVar14 - (long)pbVar9)) {
          local_60 = ~local_38;
          local_68 = (v_array<bool> *)CONCAT44(local_68._4_4_,(int)local_38 + 1);
          local_44 = ~(-1 << ((byte)local_38 & 0x1f));
          uVar11 = 1;
          uVar15 = 1;
          uVar13 = 0;
          do {
            bVar2 = pbVar9[uVar11 - 1];
            if (bVar2 == pbVar9[uVar11]) {
              pbVar9[uVar13] = bVar2;
            }
            else {
              local_70 = (float)CONCAT31(local_70._1_3_,pbVar9[uVar11]);
              uVar17 = 0xbf800000;
              local_6c = (float)CONCAT31(local_6c._1_3_,bVar2);
              if (bVar2 == false) {
                uVar17 = 0x3f800000;
              }
              sVar3 = e->tree_height;
              (peVar4->l).multi.label = uVar17;
              (peVar4->l).simple.weight = (float)(1 << ((char)(int)sVar3 + (char)local_60 & 0x1fU));
              (peVar4->l).simple.initial = 0.0;
              iVar12 = (uVar15 - 1 << ((byte)local_68 & 0x1f)) + local_44 + local_58->last_pair;
              puVar1 = &(peVar4->super_example_predict).ft_offset;
              *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(psVar5 + 0xe0) * iVar12);
              (**(code **)(psVar5 + 0x28))
                        (*(undefined8 *)(psVar5 + 0x18),*(undefined8 *)(psVar5 + 0x20),peVar4);
              puVar1 = &(peVar4->super_example_predict).ft_offset;
              *puVar1 = *puVar1 - (ulong)(uint)(iVar12 * *(int *)(psVar5 + 0xe0));
              if ((peVar4->pred).scalar < local_58->class_boundary ||
                  (peVar4->pred).scalar == local_58->class_boundary) {
                uVar10 = local_6c._0_1_;
              }
              else {
                uVar10 = local_70._0_1_;
              }
              (local_58->tournaments_won)._begin[uVar13] = (bool)uVar10;
              e = local_58;
            }
            pbVar9 = (e->tournaments_won)._begin;
            uVar13 = (long)(e->tournaments_won)._end - (long)pbVar9;
            if ((uVar13 & 1) != 0) {
              pbVar9[uVar13 >> 1] = pbVar9[uVar13 - 1];
              pbVar9 = (e->tournaments_won)._begin;
              uVar13 = (long)(e->tournaments_won)._end - (long)pbVar9;
            }
            pbVar14 = pbVar9 + (uVar13 + 1 >> 1);
            (e->tournaments_won)._end = pbVar14;
            uVar13 = (ulong)uVar15;
            uVar15 = uVar15 + 1;
            uVar11 = uVar11 + 2;
          } while (uVar13 < (ulong)((long)pbVar14 - (long)pbVar9) >> 1);
          uVar13 = e->tree_height;
        }
        local_38 = local_38 + 1;
      } while (local_38 < uVar13);
    }
  }
  return;
}

Assistant:

void ect_train(ect& e, single_learner& base, example& ec)
{
  if (e.k == 1)  // nothing to do
    return;
  MULTICLASS::label_t mc = ec.l.multi;

  label_data simple_temp;

  simple_temp.initial = 0.;

  e.tournaments_won.clear();

  uint32_t id = e.directions[mc.label - 1].winner;
  bool left = e.directions[id].left == mc.label - 1;
  do
  {
    if (left)
      simple_temp.label = -1;
    else
      simple_temp.label = 1;

    ec.l.simple = simple_temp;
    base.learn(ec, id - e.k);
    float old_weight = ec.weight;
    ec.weight = 0.;
    base.learn(ec, id - e.k);  // inefficient, we should extract final prediction exactly.
    ec.weight = old_weight;

    bool won = (ec.pred.scalar - e.class_boundary) * simple_temp.label > 0;

    if (won)
    {
      if (!e.directions[id].last)
        left = e.directions[e.directions[id].winner].left == id;
      else
        e.tournaments_won.push_back(true);
      id = e.directions[id].winner;
    }
    else
    {
      if (!e.directions[id].last)
      {
        left = e.directions[e.directions[id].loser].left == id;
        if (e.directions[id].loser == 0)
          e.tournaments_won.push_back(false);
      }
      else
        e.tournaments_won.push_back(false);
      id = e.directions[id].loser;
    }
  } while (id != 0);

  if (e.tournaments_won.size() < 1)
    cout << "badness!" << endl;

  // tournaments_won is a bit vector determining which tournaments the label won.
  for (size_t i = 0; i < e.tree_height; i++)
  {
    for (uint32_t j = 0; j < e.tournaments_won.size() / 2; j++)
    {
      bool left = e.tournaments_won[j * 2];
      bool right = e.tournaments_won[j * 2 + 1];
      if (left == right)  // no query to do
        e.tournaments_won[j] = left;
      else  // query to do
      {
        if (left)
          simple_temp.label = -1;
        else
          simple_temp.label = 1;
        simple_temp.weight = (float)(1 << (e.tree_height - i - 1));
        ec.l.simple = simple_temp;

        uint32_t problem_number = e.last_pair + j * (1 << (i + 1)) + (1 << i) - 1;

        base.learn(ec, problem_number);

        if (ec.pred.scalar > e.class_boundary)
          e.tournaments_won[j] = right;
        else
          e.tournaments_won[j] = left;
      }
      if (e.tournaments_won.size() % 2 == 1)
        e.tournaments_won[e.tournaments_won.size() / 2] = e.tournaments_won[e.tournaments_won.size() - 1];
      e.tournaments_won.end() = e.tournaments_won.begin() + (1 + e.tournaments_won.size()) / 2;
    }
  }
}